

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O3

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int ch_00;
  ulong uVar1;
  long lVar2;
  
  if (0 < ch) {
    uVar1 = 0;
    ch_00 = 0;
    do {
      if (nonzero[uVar1] != 0) {
        lVar2 = (long)ch_00;
        ch_00 = ch_00 + 1;
        in[lVar2] = in[uVar1];
      }
      uVar1 = uVar1 + 1;
    } while ((uint)ch != uVar1);
    if (ch_00 != 0) {
      _01inverse(vb,vl,in,ch_00,vorbis_book_decodevs_add);
    }
  }
  return 0;
}

Assistant:

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  int i,used=0;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];
  if(used)
    return(_01inverse(vb,vl,in,used,vorbis_book_decodevs_add));
  else
    return(0);
}